

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O3

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::do_update
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this)

{
  sc_signal_channel::notify_next_delta
            (&this->super_sc_signal_channel,(this->super_sc_signal_channel).m_change_event_p);
  (this->super_sc_signal_channel).m_change_stamp =
       ((this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object.m_simc)->
       m_change_stamp;
  (this->m_cur_val).m_val = (this->m_new_val).m_val;
  return;
}

Assistant:

inline void
sc_signal_t<T,POL>::do_update()
{
    base_type::do_update();
    m_cur_val = m_new_val;
}